

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O3

Iterator __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
::visit(BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
        *this,int key)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  IVar4;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *pBVar5;
  RbTreeNode<int,_int> *pRVar6;
  ListLink *link;
  ListLink *beforeLink;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  IVar7;
  
  IVar4.m_p = this->m_root;
  if (this->m_root == (RbTreeNode<int,_int> *)0x0) {
    bVar3 = false;
    IVar7.m_p = (RbTreeNode<int,_int> *)0x0;
  }
  else {
    do {
      IVar7.m_p = IVar4.m_p;
      iVar2 = ((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
              super_MapEntry<int,_int>.m_key;
      if (iVar2 == key) {
        return (Iterator)IVar7.m_p;
      }
      bVar3 = iVar2 != key && key <= iVar2;
      IVar4.m_p = (&((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
                    m_left)[iVar2 <= key];
    } while (IVar4.m_p != (RbTreeNode<int,_int> *)0x0);
  }
  IVar4.m_p = (Entry *)operator_new(0x38);
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
  super_MapEntry<int,_int>.m_key = 0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
  super_MapEntry<int,_int>.m_value = 0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_parent =
       (RbTreeNode<int,_int> *)0x0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
  super_MapEntry<int,_int>.super_ListLink.m_next = (ListLink *)0x0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
  super_MapEntry<int,_int>.super_ListLink.m_prev = (ListLink *)0x0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_left =
       (RbTreeNode<int,_int> *)0x0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_right =
       (RbTreeNode<int,_int> *)0x0;
  *(undefined8 *)&(IVar4.m_p)->m_color = 0;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
  super_MapEntry<int,_int>.m_key = key;
  ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_parent = IVar7.m_p
  ;
  if (IVar7.m_p == (RbTreeNode<int,_int> *)0x0) {
    this->m_root = IVar4.m_p;
    pRVar6 = (this->m_nodeList).
             super_OwningListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<int,_int>_>_>
             .
             super_ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
             .super_ListData<axl::sl::RbTreeNode<int,_int>_>.m_tail;
    ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_prev = (ListLink *)pRVar6;
    if (pRVar6 == (RbTreeNode<int,_int> *)0x0) {
      pRVar6 = (RbTreeNode<int,_int> *)this;
    }
    (((ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
       *)&(pRVar6->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
          super_MapEntry<int,_int>.super_ListLink)->super_ListData<axl::sl::RbTreeNode<int,_int>_>).
    m_head = IVar4.m_p;
    pBVar5 = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
              *)&(this->m_nodeList).
                 super_OwningListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<int,_int>_>_>
                 .
                 super_ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                 .super_ListData<axl::sl::RbTreeNode<int,_int>_>.m_tail;
  }
  else if (bVar3) {
    ((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_left = IVar4.m_p
    ;
    pBVar5 = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
              *)((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
                super_MapEntry<int,_int>.super_ListLink.m_prev;
    ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_next = (ListLink *)IVar7.m_p;
    ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_prev = (ListLink *)pBVar5;
    ((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_prev = (ListLink *)IVar4.m_p;
    if (pBVar5 == (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                   *)0x0) {
      pBVar5 = this;
    }
  }
  else {
    ((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).m_right =
         IVar4.m_p;
    pBVar5 = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
              *)((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
                super_MapEntry<int,_int>.super_ListLink.m_next;
    ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_prev = (ListLink *)IVar7.m_p;
    ((IVar4.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_next = (ListLink *)pBVar5;
    ((IVar7.m_p)->super_BinTreeNodeBase<axl::sl::RbTreeNode<int,_int>,_int,_int>).
    super_MapEntry<int,_int>.super_ListLink.m_next = (ListLink *)IVar4.m_p;
    if (pBVar5 == (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                   *)0x0) {
      pBVar5 = this;
    }
    pBVar5 = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
              *)&(pBVar5->m_nodeList).
                 super_OwningListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<int,_int>_>_>
                 .
                 super_ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
                 .super_ListData<axl::sl::RbTreeNode<int,_int>_>.m_tail;
  }
  (pBVar5->m_nodeList).
  super_OwningListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<int,_int>_>_>
  .
  super_ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::RbTreeNode<int,_int>_>.m_head = IVar4.m_p;
  psVar1 = &(this->m_nodeList).
            super_OwningListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<int,_int>_>_>
            .
            super_ListBase<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>_>
            .super_ListData<axl::sl::RbTreeNode<int,_int>_>.m_count;
  *psVar1 = *psVar1 + 1;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::onInsert
            ((RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *)this,IVar4.m_p);
  return (Iterator)IVar4.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		Node* parent = NULL;
		Node* node = m_root;

		// find the place to insert

		int cmp;

		while (node) {
			cmp = m_cmp(key, node->m_key);
			if (cmp == 0)
				return node;

			parent = node;
			node = cmp < 0 ? node->m_left : node->m_right;
		}

		// create and insert new node

		node = new (mem::ZeroInit) Node;
		node->m_key = key;
		node->m_parent = parent;

		if (!parent) {
			m_root = node;
			m_nodeList.insertTail(node);
		} else if (cmp < 0) {
			parent->m_left = node;
			m_nodeList.insertBefore(node, parent);
		} else {
			parent->m_right = node;
			m_nodeList.insertAfter(node, parent);
		}

		static_cast<T*>(this)->onInsert(node);
		return node;
	}